

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaWriteVer.c
# Opt level: O1

void Prs_ManWriteVerilogArray(FILE *pFile,Prs_Ntk_t *p,Vec_Int_t *vSigs,int fOdd)

{
  int Sig;
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  
  if (0 < vSigs->nSize) {
    if (0 < vSigs->nSize) {
      bVar1 = true;
      uVar3 = 0;
      do {
        if (fOdd == 0 || (uVar3 & 1) != 0) {
          Sig = vSigs->pArray[uVar3];
          pcVar2 = "T = %d\t\t";
          if (!bVar1) {
            pcVar2 = "    \"%s\", ";
          }
          fputs(pcVar2 + 8,(FILE *)pFile);
          Prs_ManWriteVerilogSignal(pFile,p,Sig);
          bVar1 = false;
        }
        uVar3 = uVar3 + 1;
      } while ((long)uVar3 < (long)vSigs->nSize);
    }
    return;
  }
  __assert_fail("Vec_IntSize(vSigs) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaWriteVer.c"
                ,0xc2,"void Prs_ManWriteVerilogArray(FILE *, Prs_Ntk_t *, Vec_Int_t *, int)");
}

Assistant:

void Prs_ManWriteVerilogArray( FILE * pFile, Prs_Ntk_t * p, Vec_Int_t * vSigs, int fOdd )
{
    int i, Sig, fFirst = 1;
    assert( Vec_IntSize(vSigs) > 0 );
    Vec_IntForEachEntry( vSigs, Sig, i )
    {
        if ( fOdd && !(i & 1) )
            continue;
        fprintf( pFile, "%s", fFirst ? "" : ", " );
        Prs_ManWriteVerilogSignal( pFile, p, Sig );
        fFirst = 0;
    }
}